

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

QString * Utils::exec(QString *__return_storage_ptr__,QString *cmd)

{
  FILE *__stream;
  char *pcVar1;
  runtime_error *this;
  char buffer [256];
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QString::toLocal8Bit((QByteArray *)buffer,cmd);
  if (buffer._8_8_ == 0) {
    buffer._8_8_ = &QByteArray::_empty;
  }
  __stream = popen((char *)buffer._8_8_,"r");
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)buffer);
  if (__stream == (FILE *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"popen() failed!");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  while (pcVar1 = fgets(buffer,0x100,__stream), pcVar1 != (char *)0x0) {
    QString::operator+=(__return_storage_ptr__,buffer);
  }
  pclose(__stream);
  return __return_storage_ptr__;
}

Assistant:

QString exec(const QString &cmd) {
    QString result;
    FILE* pipe = popen(cmd.toLocal8Bit().constData(), "r");

    if (!pipe)
        throw runtime_error("popen() failed!");

    try {
        char buffer[BUFFER_SIZE];

        while (fgets(buffer, sizeof(buffer), pipe) != nullptr) {
            result += buffer;
        }
    } catch (...) {
        pclose(pipe);
        throw;
    }

    pclose(pipe);

    return result;
}